

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * Extra_TransferLevelByLevel(DdManager *ddSource,DdManager *ddDestination,DdNode *f)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int *Permute;
  ulong uVar5;
  DdNode *pDVar6;
  ulong uVar7;
  
  uVar1 = ddDestination->size;
  uVar2 = ddSource->size;
  uVar3 = uVar2;
  if ((int)uVar1 < (int)uVar2) {
    uVar3 = uVar1;
  }
  uVar4 = uVar2;
  if ((int)uVar2 < (int)uVar1) {
    uVar4 = uVar1;
  }
  Permute = (int *)malloc((long)(int)uVar4 * 4);
  uVar5 = 0;
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar7 = uVar5;
  }
  for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
    Permute[ddSource->invperm[uVar5]] = ddDestination->invperm[uVar5];
  }
  if ((int)uVar1 < (int)uVar2) {
    for (; (long)uVar7 < (long)(int)uVar4; uVar7 = uVar7 + 1) {
      Permute[ddSource->invperm[uVar7]] = -1;
    }
  }
  pDVar6 = Extra_TransferPermute(ddSource,ddDestination,f,Permute);
  free(Permute);
  return pDVar6;
}

Assistant:

DdNode * Extra_TransferLevelByLevel( DdManager * ddSource, DdManager * ddDestination, DdNode * f )
{
    DdNode * bRes;
    int * pPermute;
    int nMin, nMax, i;

    nMin = ddMin(ddSource->size, ddDestination->size);
    nMax = ddMax(ddSource->size, ddDestination->size);
    pPermute = ABC_ALLOC( int, nMax );
    // set up the variable permutation
    for ( i = 0; i < nMin; i++ )
        pPermute[ ddSource->invperm[i] ] = ddDestination->invperm[i];
    if ( ddSource->size > ddDestination->size )
    {
        for (      ; i < nMax; i++ )
            pPermute[ ddSource->invperm[i] ] = -1;
    }
    bRes = Extra_TransferPermute( ddSource, ddDestination, f, pPermute );
    ABC_FREE( pPermute );
    return bRes;
}